

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

ptrdiff_t Parser_getNextToken(Parser *xmlParser)

{
  byte *ss;
  int iVar1;
  ptrdiff_t in_RAX;
  ulong uVar2;
  ptrdiff_t pStack_30;
  ptrdiff_t tlen;
  
  tlen = in_RAX;
  ixml_membuf_destroy(&xmlParser->tokenBuf);
  if (*xmlParser->curPtr == '\0') {
    return 0;
  }
  iVar1 = Parser_skipMisc(xmlParser);
  if (iVar1 != 0) {
    return 0;
  }
  ss = (byte *)xmlParser->curPtr;
  uVar2 = (ulong)*ss;
  if (uVar2 < 0x3f) {
    pStack_30 = 1;
    if ((0x6000008400000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_00125879;
    if (uVar2 == 0x2f) {
      if (ss[1] != 0x3e) {
        pStack_30 = 0;
        goto LAB_00125879;
      }
      xmlParser->savePtr = (char *)ss;
    }
    else {
      if (uVar2 != 0x3c) goto LAB_001258ce;
      iVar1 = Parser_UTF8ToInt((char *)(ss + 1),&tlen);
      if (iVar1 != 0x2f) {
        iVar1 = Parser_isNameChar(iVar1,0);
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_00125879;
      }
    }
    pStack_30 = 2;
  }
  else {
LAB_001258ce:
    iVar1 = Parser_UTF8ToInt((char *)ss,&tlen);
    iVar1 = Parser_isNameChar(iVar1,0);
    pStack_30 = tlen;
    if (iVar1 == 0) {
      return 0;
    }
    while( true ) {
      iVar1 = Parser_UTF8ToInt(xmlParser->curPtr + pStack_30,&tlen);
      iVar1 = Parser_isNameChar(iVar1,1);
      if (iVar1 == 0) break;
      pStack_30 = pStack_30 + tlen;
    }
  }
LAB_00125879:
  iVar1 = Parser_copyToken(xmlParser,xmlParser->curPtr,pStack_30);
  if (iVar1 != 0) {
    return 0;
  }
  xmlParser->curPtr = xmlParser->curPtr + pStack_30;
  return pStack_30;
}

Assistant:

static ptrdiff_t Parser_getNextToken(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	ptrdiff_t tokenLength = 0;
	int temp;
	ptrdiff_t tlen;
	int rc;

	Parser_clearTokenBuf(xmlParser);

	if (*(xmlParser->curPtr) == '\0') {
		return 0;
	}
	/* skip XML instructions */
	rc = Parser_skipMisc(xmlParser);
	if (rc != IXML_SUCCESS) {
		return 0;
	}
	/* Attribute value logic must come first, since all text untokenized
	 * until end-quote */
	if (*(xmlParser->curPtr) == QUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SINGLEQUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == LESSTHAN) {
		/* Check for start tags */
		temp = Parser_UTF8ToInt(xmlParser->curPtr + 1, &tlen);
		if (temp == '/') {
			/* token is '</' end tag */
			tokenLength = 2;
		} else if (Parser_isNameChar(temp, 0)) {
			/* '<' found, so return '<' token */
			tokenLength = 1;
		} else {
			/* error */
			return 0;
		}
	} else if (*(xmlParser->curPtr) == EQUALS) {
		/* Check for '=' token, return it as a token */
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SLASH) {
		if (*(xmlParser->curPtr + 1) == GREATERTHAN) {
			/* token '/>' found */
			tokenLength = 2;
			/* fix */
			xmlParser->savePtr = xmlParser->curPtr;
		}
	} else if (*(xmlParser->curPtr) == GREATERTHAN) {
		/* > found, so return it as a token */
		tokenLength = 1;
	} else if (Parser_isNameChar(
			   Parser_UTF8ToInt(xmlParser->curPtr, &tlen), 0)) {
		/* Check for name tokens, name found, so find out how long it is
		 */
		ptrdiff_t iIndex = tlen;

		while (Parser_isNameChar(
			Parser_UTF8ToInt(xmlParser->curPtr + iIndex, &tlen),
			1)) {
			iIndex += tlen;
		}
		tokenLength = iIndex;
	} else {
		return 0;
	}

	/* Copy the token to the return string */
	if (Parser_copyToken(xmlParser, xmlParser->curPtr, tokenLength) !=
		IXML_SUCCESS) {
		return 0;
	}

	xmlParser->curPtr += tokenLength;
	return tokenLength;
}